

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_o3lyp.c
# Opt level: O0

void x3lyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ax2;
  double ax1;
  double ac;
  double ax;
  double a0;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  dVar4 = get_ext_param(in_RDI,in_RSI,3);
  dVar5 = get_ext_param(in_RDI,in_RSI,4);
  *in_RDI->mix_coef = -dVar2 * (dVar4 + dVar5) + (1.0 - dVar1);
  in_RDI->mix_coef[1] = dVar2 * dVar4;
  in_RDI->mix_coef[2] = dVar2 * dVar5;
  in_RDI->mix_coef[3] = 1.0 - dVar3;
  in_RDI->mix_coef[4] = dVar3;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
x3lyp_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a0, ax, ac, ax1, ax2;

  assert(p != NULL);
  a0    = get_ext_param(p, ext_params, 0);
  ax    = get_ext_param(p, ext_params, 1);
  ac    = get_ext_param(p, ext_params, 2);
  ax1   = get_ext_param(p, ext_params, 3);
  ax2   = get_ext_param(p, ext_params, 4);

  p->mix_coef[0] = 1.0 - a0 - ax*(ax1 + ax2);
  p->mix_coef[1] = ax*ax1;
  p->mix_coef[2] = ax*ax2;
  p->mix_coef[3] = 1.0 - ac;
  p->mix_coef[4] = ac;

  p->cam_alpha = a0;
}